

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall QObjectPrivate::deleteChildren(QObjectPrivate *this)

{
  QList<QObject_*> *this_00;
  qsizetype qVar1;
  const_reference ppQVar2;
  reference ppQVar3;
  long in_RDI;
  int i;
  long *in_stack_ffffffffffffffd8;
  undefined4 local_c;
  
  *(uint *)(in_RDI + 0x30) = *(uint *)(in_RDI + 0x30) & 0xfffffff7 | 8;
  local_c = 0;
  while( true ) {
    this_00 = (QList<QObject_*> *)(long)local_c;
    qVar1 = QList<QObject_*>::size((QList<QObject_*> *)(in_RDI + 0x18));
    if (qVar1 <= (long)this_00) break;
    ppQVar2 = QList<QObject_*>::at(this_00,(qsizetype)in_stack_ffffffffffffffd8);
    *(QObject **)(in_RDI + 0x68) = *ppQVar2;
    ppQVar3 = QList<QObject_*>::operator[](this_00,(qsizetype)in_stack_ffffffffffffffd8);
    *ppQVar3 = (QObject *)0x0;
    in_stack_ffffffffffffffd8 = *(long **)(in_RDI + 0x68);
    if (in_stack_ffffffffffffffd8 != (long *)0x0) {
      (**(code **)(*in_stack_ffffffffffffffd8 + 0x20))();
    }
    local_c = local_c + 1;
  }
  QList<QObject_*>::clear(this_00);
  *(undefined8 *)(in_RDI + 0x68) = 0;
  *(uint *)(in_RDI + 0x30) = *(uint *)(in_RDI + 0x30) & 0xfffffff7;
  return;
}

Assistant:

void QObjectPrivate::deleteChildren()
{
    Q_ASSERT_X(!isDeletingChildren, "QObjectPrivate::deleteChildren()", "isDeletingChildren already set, did this function recurse?");
    isDeletingChildren = true;
    // delete children objects
    // don't use qDeleteAll as the destructor of the child might
    // delete siblings
    for (int i = 0; i < children.size(); ++i) {
        currentChildBeingDeleted = children.at(i);
        children[i] = nullptr;
        delete currentChildBeingDeleted;
    }
    children.clear();
    currentChildBeingDeleted = nullptr;
    isDeletingChildren = false;
}